

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
cnn::Concatenate::backward_impl
          (Concatenate *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint n;
  uint uVar1;
  pointer puVar2;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> MStack_b8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_98;
  MatrixBase<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
  local_78 [80];
  
  puVar2 = (this->src_row_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)i <
      (ulong)((long)(this->src_row_indices).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2 >> 2)) {
    n = (dEdxi->d).d[0];
    uVar1 = puVar2[i];
    Tensor::operator*(&local_98,dEdf);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::middleRows<unsigned_int>
              ((Type *)local_78,
               (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                *)&local_98,(ulong)uVar1,n);
    Tensor::operator*(&MStack_b8,dEdxi);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
    operator+=((MatrixBase<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>> *)
               &MStack_b8,local_78);
    return;
  }
  __assert_fail("i < src_row_indices.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                ,0x3a3,
                "virtual void cnn::Concatenate::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
               );
}

Assistant:

void Concatenate::backward_impl(const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  assert(i < src_row_indices.size());
  const unsigned rows = dEdxi.d.rows();
  const unsigned begin = src_row_indices[i];
#if HAVE_CUDA
  CUBLAS_CHECK(cublasSaxpy(cublas_handle, rows, kSCALAR_ONE, &dEdf.v[begin], 1, dEdxi.v, 1));
#else
  *dEdxi += (*dEdf).middleRows(begin, rows);
#endif
}